

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puff.cpp
# Opt level: O0

int construct(huffman *h,short *length,int n)

{
  short sVar1;
  short *psVar2;
  short asStack_58 [4];
  short offs [16];
  int local_30;
  int local_2c;
  int left;
  int len;
  int symbol;
  int n_local;
  short *length_local;
  huffman *h_local;
  
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    h->count[local_2c] = 0;
  }
  for (left = 0; left < n; left = left + 1) {
    h->count[length[left]] = h->count[length[left]] + 1;
  }
  if (*h->count == n) {
    h_local._4_4_ = 0;
  }
  else {
    local_30 = 1;
    for (local_2c = 1; local_2c < 0x10; local_2c = local_2c + 1) {
      local_30 = local_30 * 2 - (int)h->count[local_2c];
      if (local_30 < 0) {
        return local_30;
      }
    }
    asStack_58[1] = 0;
    for (local_2c = 1; local_2c < 0xf; local_2c = local_2c + 1) {
      asStack_58[local_2c + 1] = asStack_58[local_2c] + h->count[local_2c];
    }
    for (left = 0; left < n; left = left + 1) {
      if (length[left] != 0) {
        psVar2 = h->symbol;
        sVar1 = asStack_58[length[left]];
        asStack_58[length[left]] = sVar1 + 1;
        psVar2[sVar1] = (short)left;
      }
    }
    h_local._4_4_ = local_30;
  }
  return h_local._4_4_;
}

Assistant:

local int construct(struct huffman *h, const short *length, int n)
{
    int symbol;         /* current symbol when stepping through length[] */
    int len;            /* current length when stepping through h->count[] */
    int left;           /* number of possible codes left of current length */
    short offs[MAXBITS+1];      /* offsets in symbol table for each length */

    /* count number of codes of each length */
    for (len = 0; len <= MAXBITS; len++)
        h->count[len] = 0;
    for (symbol = 0; symbol < n; symbol++)
        (h->count[length[symbol]])++;   /* assumes lengths are within bounds */
    if (h->count[0] == n)               /* no codes! */
        return 0;                       /* complete, but decode() will fail */

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;                           /* one possible code of zero length */
    for (len = 1; len <= MAXBITS; len++) {
        left <<= 1;                     /* one more bit, double codes left */
        left -= h->count[len];          /* deduct count from possible codes */
        if (left < 0)
            return left;                /* over-subscribed--return negative */
    }                                   /* left > 0 means incomplete */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAXBITS; len++)
        offs[len + 1] = offs[len] + h->count[len];

    /*
     * put symbols in table sorted by length, by symbol order within each
     * length
     */
    for (symbol = 0; symbol < n; symbol++)
        if (length[symbol] != 0)
            h->symbol[offs[length[symbol]]++] = symbol;

    /* return zero for complete set, positive for incomplete set */
    return left;
}